

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O0

ssh_key * ppk_load_s_wrapper(BinarySource *src,char **comment,char *passphrase,char **errorstr)

{
  ssh2_userkey *ptr;
  ssh_key *toret;
  ssh2_userkey *uk;
  char **errorstr_local;
  char *passphrase_local;
  char **comment_local;
  BinarySource *src_local;
  
  ptr = ppk_load_s(src,passphrase,errorstr);
  if (ptr == &ssh2_wrong_passphrase) {
    *errorstr = "SSH2_WRONG_PASSPHRASE";
    src_local = (BinarySource *)0x0;
  }
  else if (ptr == (ssh2_userkey *)0x0) {
    src_local = (BinarySource *)0x0;
  }
  else {
    src_local = (BinarySource *)ptr->key;
    *comment = ptr->comment;
    safefree(ptr);
  }
  return (ssh_key *)src_local;
}

Assistant:

ssh_key *ppk_load_s_wrapper(BinarySource *src, char **comment,
                            const char *passphrase, const char **errorstr)
{
    ssh2_userkey *uk = ppk_load_s(src, passphrase, errorstr);
    if (uk == SSH2_WRONG_PASSPHRASE) {
        /* Fudge this special return value */
        *errorstr = "SSH2_WRONG_PASSPHRASE";
        return NULL;
    }
    if (uk == NULL)
        return NULL;
    ssh_key *toret = uk->key;
    *comment = uk->comment;
    sfree(uk);
    return toret;
}